

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findfunction.cpp
# Opt level: O0

void comparator(string *gtn,string *ltn,string *eqt,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *b,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *c,int i)

{
  int iVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar2;
  bool bVar3;
  reference pvVar4;
  allocator local_2b1;
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [39];
  allocator local_249;
  string local_248 [32];
  string local_228 [32];
  string local_208 [39];
  allocator local_1e1;
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  string local_158 [32];
  string local_138 [39];
  allocator local_111;
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [39];
  allocator local_a9;
  string local_a8 [48];
  string local_78 [32];
  string local_58 [36];
  int local_34;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_30;
  int i_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *c_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *b_local;
  string *eqt_local;
  string *ltn_local;
  string *gtn_local;
  
  local_34 = i;
  pvStack_30 = c;
  c_local = b;
  b_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)eqt;
  eqt_local = ltn;
  ltn_local = gtn;
  pvVar4 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](b,(long)(i + 2));
  bVar3 = std::operator==(pvVar4,">");
  if (bVar3) {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](c_local,(long)(local_34 + -1));
    std::__cxx11::string::operator=((string *)ltn_local,(string *)pvVar4);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](c_local,(long)(local_34 + 1));
    std::__cxx11::string::string(local_58,(string *)pvVar4);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](c_local,(long)(local_34 + 3));
    std::__cxx11::string::string(local_78,(string *)pvVar4);
    pvVar2 = c_local;
    iVar1 = local_34;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"<",&local_a9);
    bVar3 = searchcomp((string *)local_58,(string *)local_78,iVar1,pvVar2,(string *)local_a8,
                       eqt_local);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    std::__cxx11::string::~string(local_78);
    std::__cxx11::string::~string(local_58);
    if (bVar3) {
      searchwire(pvStack_30,eqt_local,ltn_local);
    }
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](c_local,(long)(local_34 + 1));
    std::__cxx11::string::string(local_d0,(string *)pvVar4);
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](c_local,(long)(local_34 + 3));
    std::__cxx11::string::string(local_f0,(string *)pvVar4);
    pvVar2 = c_local;
    iVar1 = local_34;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"==",&local_111);
    bVar3 = searchcomp((string *)local_d0,(string *)local_f0,iVar1,pvVar2,(string *)local_110,
                       (string *)b_local);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    std::__cxx11::string::~string(local_f0);
    std::__cxx11::string::~string(local_d0);
    if (bVar3) {
      searchwire(pvStack_30,(string *)b_local,ltn_local);
    }
  }
  else {
    pvVar4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](c_local,(long)(local_34 + 2));
    bVar3 = std::operator==(pvVar4,"<");
    if (bVar3) {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](c_local,(long)(local_34 + -1));
      std::__cxx11::string::operator=((string *)eqt_local,(string *)pvVar4);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](c_local,(long)(local_34 + 1));
      std::__cxx11::string::string(local_138,(string *)pvVar4);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](c_local,(long)(local_34 + 3));
      std::__cxx11::string::string(local_158,(string *)pvVar4);
      pvVar2 = c_local;
      iVar1 = local_34;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,">",&local_179);
      bVar3 = searchcomp((string *)local_138,(string *)local_158,iVar1,pvVar2,(string *)local_178,
                         ltn_local);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_138);
      if (bVar3) {
        searchwire(pvStack_30,ltn_local,eqt_local);
      }
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](c_local,(long)(local_34 + 1));
      std::__cxx11::string::string(local_1a0,(string *)pvVar4);
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](c_local,(long)(local_34 + 3));
      std::__cxx11::string::string(local_1c0,(string *)pvVar4);
      pvVar2 = c_local;
      iVar1 = local_34;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1e0,"==",&local_1e1);
      bVar3 = searchcomp((string *)local_1a0,(string *)local_1c0,iVar1,pvVar2,(string *)local_1e0,
                         (string *)b_local);
      std::__cxx11::string::~string(local_1e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
      std::__cxx11::string::~string(local_1c0);
      std::__cxx11::string::~string(local_1a0);
      if (bVar3) {
        searchwire(pvStack_30,(string *)b_local,eqt_local);
      }
    }
    else {
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](c_local,(long)(local_34 + 2));
      bVar3 = std::operator==(pvVar4,"==");
      if (bVar3) {
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](c_local,(long)(local_34 + -1));
        std::__cxx11::string::operator=((string *)b_local,(string *)pvVar4);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](c_local,(long)(local_34 + 1));
        std::__cxx11::string::string(local_208,(string *)pvVar4);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](c_local,(long)(local_34 + 3));
        std::__cxx11::string::string(local_228,(string *)pvVar4);
        pvVar2 = c_local;
        iVar1 = local_34;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_248,">",&local_249);
        bVar3 = searchcomp((string *)local_208,(string *)local_228,iVar1,pvVar2,(string *)local_248,
                           ltn_local);
        std::__cxx11::string::~string(local_248);
        std::allocator<char>::~allocator((allocator<char> *)&local_249);
        std::__cxx11::string::~string(local_228);
        std::__cxx11::string::~string(local_208);
        if (bVar3) {
          searchwire(pvStack_30,ltn_local,(string *)b_local);
        }
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](c_local,(long)(local_34 + 1));
        std::__cxx11::string::string(local_270,(string *)pvVar4);
        pvVar4 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](c_local,(long)(local_34 + 3));
        std::__cxx11::string::string(local_290,(string *)pvVar4);
        pvVar2 = c_local;
        iVar1 = local_34;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2b0,"<",&local_2b1);
        bVar3 = searchcomp((string *)local_270,(string *)local_290,iVar1,pvVar2,(string *)local_2b0,
                           eqt_local);
        std::__cxx11::string::~string(local_2b0);
        std::allocator<char>::~allocator((allocator<char> *)&local_2b1);
        std::__cxx11::string::~string(local_290);
        std::__cxx11::string::~string(local_270);
        if (bVar3) {
          searchwire(pvStack_30,eqt_local,(string *)b_local);
        }
      }
    }
  }
  return;
}

Assistant:

void comparator(string *gtn, string *ltn, string *eqt, vector<string> & b, vector<string> & c,int i)
{
	
	if (b[i + 2] == ">")
	{
		*gtn = b[i - 1];
		if (searchcomp(b[i + 1], b[i + 3], i, b, "<", ltn))			// search for lesser than condition
			searchwire(c, ltn,gtn);
		if( searchcomp(b[i+1], b[i + 3], i, b, "==",eqt))			//search for equal to condition
			searchwire(c, eqt, gtn);
	}
	else if (b[i + 2] == "<")
	{
		*ltn = b[i - 1];
		if (searchcomp(b[i+1], b[i + 3], i, b, ">", gtn))			// search for greater than condition
			searchwire(c, gtn, ltn);
		if (searchcomp(b[i + 1], b[i + 3], i, b, "==", eqt))			//search for equal to condition
			searchwire(c, eqt, ltn);
	}
	else if (b[i + 2] == "==")
	{
		*eqt = b[i - 1];
		if (searchcomp(b[i + 1], b[i + 3], i, b, ">", gtn))			// search for greater than condition
			searchwire(c, gtn, eqt);
		if (searchcomp(b[i + 1], b[i + 3], i, b, "<", ltn))			// search for lesser than condition
			searchwire(c, ltn, eqt);
	}

}